

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

void Dar_LibDumpPriorities(void)

{
  uint uVar1;
  uint local_24;
  int local_20;
  int local_1c;
  int Printed;
  int Counter;
  int Out2;
  int Out;
  int k;
  int i;
  
  local_1c = 0;
  local_20 = 0;
  printf("\nOutput priorities (total = %d):\n",(ulong)(uint)s_DarLib->nSubgrTotal);
  Out = 0;
  do {
    if (0xdd < Out) {
      printf("\n");
      if (local_20 != s_DarLib->nSubgrTotal) {
        __assert_fail("Printed == s_DarLib->nSubgrTotal",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darLib.c"
                      ,0x2b3,"void Dar_LibDumpPriorities()");
      }
      return;
    }
    for (Out2 = 0; Out2 < s_DarLib->nSubgr[Out]; Out2 = Out2 + 1) {
      uVar1 = s_DarLib->pPrios[Out][Out2];
      local_24 = uVar1;
      if (Out2 != 0) {
        local_24 = s_DarLib->pPrios[Out][Out2 + -1];
      }
      if (s_DarLib->pScore[Out][(int)local_24] < s_DarLib->pScore[Out][(int)uVar1]) {
        __assert_fail("s_DarLib->pScore[i][Out2] >= s_DarLib->pScore[i][Out]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darLib.c"
                      ,0x2a7,"void Dar_LibDumpPriorities()");
      }
      printf("%d, ",(ulong)uVar1);
      local_20 = local_20 + 1;
      local_1c = local_1c + 1;
      if (local_1c == 0xf) {
        printf("\n");
        local_1c = 0;
      }
    }
    Out = Out + 1;
  } while( true );
}

Assistant:

void Dar_LibDumpPriorities()
{
    int i, k, Out, Out2, Counter = 0, Printed = 0;
    printf( "\nOutput priorities (total = %d):\n", s_DarLib->nSubgrTotal );
    for ( i = 0; i < 222; i++ )
    {
//        printf( "Class%d: ", i );
        for ( k = 0; k < s_DarLib->nSubgr[i]; k++ )
        {
            Out = s_DarLib->pPrios[i][k];
            Out2 = k == 0 ? Out : s_DarLib->pPrios[i][k-1];
            assert( s_DarLib->pScore[i][Out2] >= s_DarLib->pScore[i][Out] );
//            printf( "%d(%d), ", Out, s_DarLib->pScore[i][Out] );
            printf( "%d, ", Out );
            Printed++;
            if ( ++Counter == 15 )
            {
                printf( "\n" );
                Counter = 0;
            }
        }
    }
    printf( "\n" );
    assert( Printed == s_DarLib->nSubgrTotal );
}